

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void fmt::v6::vprint(FILE *f,string_view format_str,format_args args)

{
  undefined **local_230;
  undefined1 *local_228;
  size_t sStack_220;
  undefined8 local_218;
  undefined1 local_210 [504];
  
  sStack_220 = 0;
  local_230 = &PTR_grow_00203560;
  local_218 = 500;
  local_228 = local_210;
  vformat_to<fmt::v6::arg_formatter<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char>>
            ((buffer<char> *)&local_230,format_str,
             args.
             super_basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
             ,(locale_ref)0x0);
  detail::fwrite_fully(local_228,1,sStack_220,f);
  local_230 = &PTR_grow_00203560;
  if (local_228 != local_210) {
    operator_delete(local_228);
  }
  return;
}

Assistant:

FMT_FUNC void vprint(std::FILE* f, string_view format_str, format_args args) {
  memory_buffer buffer;
  detail::vformat_to(buffer, format_str,
                     basic_format_args<buffer_context<char>>(args));
#ifdef _WIN32
  auto fd = _fileno(f);
  if (_isatty(fd)) {
    detail::utf8_to_utf16 u16(string_view(buffer.data(), buffer.size()));
    auto written = DWORD();
    if (!WriteConsoleW(reinterpret_cast<HANDLE>(_get_osfhandle(fd)),
                       u16.c_str(), static_cast<DWORD>(u16.size()), &written,
                       nullptr)) {
      FMT_THROW(format_error("failed to write to console"));
    }
    return;
  }
#endif
  detail::fwrite_fully(buffer.data(), 1, buffer.size(), f);
}